

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment-map.c
# Opt level: O0

mi_segmap_part_t *
mi_segment_map_index_of(mi_segment_t *segment,_Bool create_on_demand,size_t *idx,size_t *bitidx)

{
  mi_memid_t memid_00;
  ulong uVar1;
  mi_segmap_part_t *pmVar2;
  ulong *in_RCX;
  ulong *in_RDX;
  byte in_SIL;
  ulong in_RDI;
  bool bVar3;
  uintptr_t bitofs;
  uintptr_t offset;
  mi_segmap_part_t *expected;
  mi_memid_t memid;
  mi_segmap_part_t *part;
  uintptr_t segindex;
  undefined7 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  mi_memid_t *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  size_t sStack_50;
  size_t local_48;
  mi_segmap_part_t *local_38;
  mi_segmap_part_t *local_8;
  
  *in_RDX = 0;
  *in_RCX = 0;
  if (in_RDI < 0x300000000000) {
    uVar1 = in_RDI / 0x1f800000000;
    if (uVar1 < 0x19) {
      local_38 = mi_segment_map[uVar1];
      if (mi_segment_map[uVar1] == (mi_segmap_part_t *)0x0) {
        if ((in_SIL & 1) == 0) {
          return (mi_segmap_part_t *)0x0;
        }
        local_38 = (mi_segmap_part_t *)
                   _mi_os_alloc(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        if (local_38 == (mi_segmap_part_t *)0x0) {
          return (mi_segmap_part_t *)0x0;
        }
        (local_38->memid).is_pinned = (_Bool)(undefined1)local_48;
        (local_38->memid).initially_committed = (_Bool)local_48._1_1_;
        (local_38->memid).initially_zero = (_Bool)local_48._2_1_;
        (local_38->memid).field_0x13 = local_48._3_1_;
        (local_38->memid).memkind = local_48._4_4_;
        (local_38->memid).mem.arena.block_index = in_stack_ffffffffffffffa8;
        (local_38->memid).mem.os.size = sStack_50;
        LOCK();
        pmVar2 = mi_segment_map[uVar1];
        bVar3 = pmVar2 == (mi_segmap_part_t *)0x0;
        if (bVar3) {
          mi_segment_map[uVar1] = local_38;
          pmVar2 = (mi_segmap_part_t *)0x0;
        }
        UNLOCK();
        if ((!bVar3) &&
           (memid_00.mem.os.size = in_stack_ffffffffffffff88,
           memid_00.mem.os.base = (void *)in_stack_ffffffffffffff80,
           memid_00._16_7_ = in_stack_ffffffffffffff90, memid_00.memkind._3_1_ = bVar3,
           _mi_os_free((void *)CONCAT17(bVar3,in_stack_ffffffffffffff70),local_48,memid_00),
           local_38 = pmVar2, pmVar2 == (mi_segmap_part_t *)0x0)) {
          return (mi_segmap_part_t *)0x0;
        }
      }
      *in_RDX = in_RDI % 0x1f800000000 >> 0x1f;
      *in_RCX = in_RDI % 0x1f800000000 >> 0x19 & 0x3f;
      local_8 = local_38;
    }
    else {
      local_8 = (mi_segmap_part_t *)0x0;
    }
  }
  else {
    local_8 = (mi_segmap_part_t *)0x0;
  }
  return local_8;
}

Assistant:

static mi_segmap_part_t* mi_segment_map_index_of(const mi_segment_t* segment, bool create_on_demand, size_t* idx, size_t* bitidx) {
  // note: segment can be invalid or NULL.
  mi_assert_internal(_mi_ptr_segment(segment + 1) == segment); // is it aligned on MI_SEGMENT_SIZE?
  *idx = 0;
  *bitidx = 0;  
  if ((uintptr_t)segment >= MI_SEGMENT_MAP_MAX_ADDRESS) return NULL;
  const uintptr_t segindex = ((uintptr_t)segment) / MI_SEGMENT_MAP_PART_SPAN;
  if (segindex >= MI_SEGMENT_MAP_MAX_PARTS) return NULL;
  mi_segmap_part_t* part = mi_atomic_load_ptr_relaxed(mi_segmap_part_t, &mi_segment_map[segindex]);

  // allocate on demand to reduce .bss footprint
  if mi_unlikely(part == NULL) {
    if (!create_on_demand) return NULL;
    mi_memid_t memid;
    part = (mi_segmap_part_t*)_mi_os_alloc(sizeof(mi_segmap_part_t), &memid);
    if (part == NULL) return NULL;
    part->memid = memid;
    mi_segmap_part_t* expected = NULL;
    if (!mi_atomic_cas_ptr_strong_release(mi_segmap_part_t, &mi_segment_map[segindex], &expected, part)) {
      _mi_os_free(part, sizeof(mi_segmap_part_t), memid);
      part = expected;
      if (part == NULL) return NULL;
    }
  }